

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O0

void printtree(Tree t)

{
  Branch *pBVar1;
  uint local_1c;
  uint uStack_18;
  int i;
  Tree t_local;
  
  pBVar1 = t.branch;
  for (local_1c = 0; uStack_18 = t.deg, (int)local_1c < (int)uStack_18; local_1c = local_1c + 1) {
    printf(" %-2d:  x=%4g  y=%4g  e=%d\n",(double)pBVar1[(int)local_1c].x,
           (double)pBVar1[(int)local_1c].y,(ulong)local_1c,(ulong)(uint)pBVar1[(int)local_1c].n);
  }
  for (local_1c = uStack_18; (int)local_1c < (int)(uStack_18 * 2 + -2); local_1c = local_1c + 1) {
    printf("s%-2d:  x=%4g  y=%4g  e=%d\n",(double)pBVar1[(int)local_1c].x,
           (double)pBVar1[(int)local_1c].y,(ulong)local_1c,(ulong)(uint)pBVar1[(int)local_1c].n);
  }
  printf("\n");
  return;
}

Assistant:

void printtree(Tree t)
{
    int i;

    for (i=0; i<t.deg; i++)
        printf(" %-2d:  x=%4g  y=%4g  e=%d\n",
               i, (float) t.branch[i].x, (float) t.branch[i].y, t.branch[i].n);
    for (i=t.deg; i<2*t.deg-2; i++)
        printf("s%-2d:  x=%4g  y=%4g  e=%d\n",
               i, (float) t.branch[i].x, (float) t.branch[i].y, t.branch[i].n);
    printf("\n");
}